

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppressionValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)610>(Result *__return_storage_ptr__,Model *format)

{
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this;
  uint32 uVar1;
  string *psVar2;
  uint64 uVar3;
  long lVar4;
  NonMaximumSuppression *pNVar5;
  NonMaximumSuppression *pNVar6;
  RepeatedPtrFieldBase *this_00;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Type *pTVar12;
  Type *pTVar13;
  Type *pTVar14;
  ArrayFeatureType *pAVar15;
  ostream *poVar16;
  ArrayFeatureType_ShapeRange *pAVar17;
  ArrayFeatureType_EnumeratedShapes *pAVar18;
  Type *pTVar19;
  int64 iVar20;
  int64 iVar21;
  ArrayFeatureType_ShapeRange *pAVar22;
  Type *pTVar23;
  Int64Vector *pIVar24;
  StringVector *pSVar25;
  RepeatedField<long> *pRVar26;
  ulong uVar27;
  ulong uVar28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar29;
  FeatureType *pFVar30;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  ModelDescription *interface;
  RepeatedPtrField<CoreML::Specification::SizeRange> *this_01;
  int iVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_01;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_02;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_03;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  NonMaximumSuppression *local_2a0;
  string local_298;
  Type *local_278;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  Result result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  Model *local_208;
  RepeatedPtrFieldBase *local_200;
  stringstream ss;
  string local_1f0 [8];
  ostream local_1e8 [376];
  string local_70;
  string local_50;
  
  interface = format->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  local_2a0 = Specification::Model::nonmaximumsuppression(format);
  Result::Result(&result);
  validateModelDescription((Result *)&ss,interface,format->specificationversion_);
  Result::operator=(&result,(Result *)&ss);
  std::__cxx11::string::~string(local_1f0);
  bVar7 = Result::good(&result);
  pNVar5 = local_2a0;
  if (!bVar7) goto LAB_0056c38a;
  this = &interface->input_;
  local_200 = &(interface->output_).super_RepeatedPtrFieldBase;
  local_26c = -1;
  local_278 = (Type *)CONCAT44(local_278._4_4_,0xffffffff);
  local_268 = local_26c;
  local_264 = local_26c;
  local_208 = format;
  for (iVar31 = 0; this_00 = local_200, pNVar6 = local_2a0,
      iVar31 < (interface->input_).super_RepeatedPtrFieldBase.current_size_; iVar31 = iVar31 + 1) {
    pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                        (&this->super_RepeatedPtrFieldBase,iVar31);
    pbVar29 = (pTVar12->name_).ptr_;
    iVar8 = std::__cxx11::string::compare((string *)(pNVar5->confidenceinputfeaturename_).ptr_);
    iVar9 = (int)local_278;
    if (iVar8 == 0) {
      iVar9 = iVar31;
    }
    local_278 = (Type *)CONCAT44(local_278._4_4_,iVar9);
    iVar9 = std::__cxx11::string::compare((string *)(pNVar5->coordinatesinputfeaturename_).ptr_);
    if (iVar9 == 0) {
      local_26c = iVar31;
    }
    iVar10 = std::__cxx11::string::compare((string *)(pNVar5->iouthresholdinputfeaturename_).ptr_);
    if (iVar10 == 0) {
      local_264 = iVar31;
    }
    iVar11 = std::__cxx11::string::compare
                       ((string *)(pNVar5->confidencethresholdinputfeaturename_).ptr_);
    if ((((iVar8 != 0) && (iVar9 != 0)) && (iVar10 != 0)) && (iVar11 != 0)) {
      std::operator+(&local_2c0,"Input feature \'",pbVar29);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &local_2c0,
                     "\' was not requested by any of the input feature names (e.g. confidenceInputFeatureName)."
                    );
      Result::Result(__return_storage_ptr__,TOO_MANY_FEATURES_FOR_MODEL_TYPE,(string *)&ss);
      goto LAB_0056b83c;
    }
    if (iVar11 == 0) {
      local_268 = iVar31;
    }
  }
  if ((int)local_278 == -1) {
    std::operator+(&local_2c0,"Expected feature \'",(local_2a0->confidenceinputfeaturename_).ptr_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                   &local_2c0,
                   "\' (as defined by confidenceInputFeatureName) to the model is not present in the model description."
                  );
    Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,(string *)&ss);
LAB_0056b83c:
    std::__cxx11::string::~string((string *)&ss);
    pbVar29 = &local_2c0;
  }
  else {
    if (local_26c == -1) {
      std::operator+(&local_2c0,"Expected feature \'",(local_2a0->coordinatesinputfeaturename_).ptr_
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &local_2c0,
                     "\' (as defined by coordinatesInputFeatureName) to the model is not present in the model description."
                    );
      Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,(string *)&ss);
      goto LAB_0056b83c;
    }
    iVar31 = -1;
    local_270 = -1;
    for (iVar9 = 0; iVar9 < (interface->output_).super_RepeatedPtrFieldBase.current_size_;
        iVar9 = iVar9 + 1) {
      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                          (this_00,iVar9);
      pbVar29 = (pTVar12->name_).ptr_;
      iVar8 = std::__cxx11::string::compare((string *)(pNVar6->confidenceoutputfeaturename_).ptr_);
      if (iVar8 == 0) {
        local_270 = iVar9;
      }
      iVar10 = std::__cxx11::string::compare((string *)(pNVar6->coordinatesoutputfeaturename_).ptr_)
      ;
      if (iVar10 != 0 && iVar8 != 0) {
        std::operator+(&local_2c0,"Output feature \'",pbVar29);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                       &local_2c0,
                       "\' was not requested by any of the output feature names (e.g. confidenceOutputFeatureName)."
                      );
        Result::Result(__return_storage_ptr__,TOO_MANY_FEATURES_FOR_MODEL_TYPE,(string *)&ss);
        goto LAB_0056b83c;
      }
      if (iVar10 == 0) {
        iVar31 = iVar9;
      }
    }
    if (local_270 == -1) {
      std::operator+(&local_2c0,"Expected feature \'",(local_2a0->confidenceoutputfeaturename_).ptr_
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &local_2c0,
                     "\' (as defined by confidenceOutputFeatureName) from the model is not present in the model description."
                    );
      Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,(string *)&ss);
      goto LAB_0056b83c;
    }
    if (iVar31 == -1) {
      std::operator+(&local_2c0,"Expected feature \'",
                     (local_2a0->coordinatesoutputfeaturename_).ptr_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &local_2c0,
                     "\' (as defined by coordinatesOutputFeatureName) from the model is not present in the model description."
                    );
      Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,(string *)&ss);
      goto LAB_0056b83c;
    }
    psVar2 = (local_2a0->confidenceinputfeaturename_).ptr_;
    local_298._M_dataplus._M_p._0_4_ = 5;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_298;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_2c0,__l,(allocator_type *)&local_228);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)&ss,(CoreML *)this,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar2,&local_2c0,
               in_R8);
    Result::operator=(&result,(Result *)&ss);
    std::__cxx11::string::~string(local_1f0);
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                     *)&local_2c0);
    bVar7 = Result::good(&result);
    if (!bVar7) {
LAB_0056c38a:
      Result::Result(__return_storage_ptr__,&result);
      goto LAB_0056c39b;
    }
    psVar2 = (local_2a0->coordinatesinputfeaturename_).ptr_;
    local_298._M_dataplus._M_p._0_4_ = 5;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_298;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_2c0,__l_00,(allocator_type *)&local_228);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)&ss,(CoreML *)this,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar2,&local_2c0,
               in_R8);
    Result::operator=(&result,(Result *)&ss);
    std::__cxx11::string::~string(local_1f0);
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                     *)&local_2c0);
    bVar7 = Result::good(&result);
    if (!bVar7) goto LAB_0056c38a;
    if (-1 < local_264) {
      psVar2 = (local_2a0->iouthresholdinputfeaturename_).ptr_;
      local_298._M_dataplus._M_p._0_4_ = 2;
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)&local_298;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)&local_2c0,__l_01,(allocator_type *)&local_228);
      validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)&ss,(CoreML *)this,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar2,&local_2c0,
                 in_R8);
      Result::operator=(&result,(Result *)&ss);
      std::__cxx11::string::~string(local_1f0);
      std::
      _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                       *)&local_2c0);
      bVar7 = Result::good(&result);
      if (!bVar7) goto LAB_0056c38a;
    }
    if (-1 < local_268) {
      psVar2 = (local_2a0->confidencethresholdinputfeaturename_).ptr_;
      local_298._M_dataplus._M_p._0_4_ = 2;
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)&local_298;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)&local_2c0,__l_02,(allocator_type *)&local_228);
      validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)&ss,(CoreML *)this,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar2,&local_2c0,
                 in_R8);
      Result::operator=(&result,(Result *)&ss);
      std::__cxx11::string::~string(local_1f0);
      std::
      _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                       *)&local_2c0);
      bVar7 = Result::good(&result);
      if (!bVar7) goto LAB_0056c38a;
    }
    psVar2 = (local_2a0->confidenceoutputfeaturename_).ptr_;
    local_298._M_dataplus._M_p._0_4_ = 5;
    __l_03._M_len = 1;
    __l_03._M_array = (iterator)&local_298;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_2c0,__l_03,(allocator_type *)&local_228);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)&ss,(CoreML *)this_00,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar2,&local_2c0,
               in_R8);
    Result::operator=(&result,(Result *)&ss);
    std::__cxx11::string::~string(local_1f0);
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                     *)&local_2c0);
    bVar7 = Result::good(&result);
    if (!bVar7) goto LAB_0056c38a;
    psVar2 = (local_2a0->coordinatesoutputfeaturename_).ptr_;
    local_298._M_dataplus._M_p._0_4_ = 5;
    __l_04._M_len = 1;
    __l_04._M_array = (iterator)&local_298;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_2c0,__l_04,(allocator_type *)&local_228);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)&ss,(CoreML *)this_00,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar2,&local_2c0,
               in_R8);
    Result::operator=(&result,(Result *)&ss);
    std::__cxx11::string::~string(local_1f0);
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                     *)&local_2c0);
    bVar7 = Result::good(&result);
    if (!bVar7) goto LAB_0056c38a;
    if ((local_2a0->iouthreshold_ < 0.0) || (1.0 < local_2a0->iouthreshold_)) {
      std::__cxx11::string::string
                ((string *)&ss,"iouThreshold must be a value between 0.0 and 1.0.",
                 (allocator *)&local_2c0);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ss);
LAB_0056b889:
      pbVar29 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss;
    }
    else {
      if (local_2a0->confidencethreshold_ < 0.0) {
        std::__cxx11::string::string
                  ((string *)&ss,
                   "confidenceThreshold must be a non-negative value. If you do not want to eliminate any predictions based on confidence, set it to 0.0."
                   ,(allocator *)&local_2c0);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ss);
        goto LAB_0056b889;
      }
      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                          (&this->super_RepeatedPtrFieldBase,(int)local_278);
      pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                          (&this->super_RepeatedPtrFieldBase,local_26c);
      pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                          (this_00,local_270);
      local_278 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                            (this_00,iVar31);
      pFVar30 = pTVar12->type_;
      if (pFVar30 == (FeatureType *)0x0) {
        pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      pAVar15 = Specification::FeatureType::multiarraytype(pFVar30);
      pFVar30 = pTVar14->type_;
      if (pFVar30 == (FeatureType *)0x0) {
        pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      iVar31 = pAVar15->datatype_;
      pAVar15 = Specification::FeatureType::multiarraytype(pFVar30);
      pFVar30 = pTVar13->type_;
      if (pFVar30 == (FeatureType *)0x0) {
        pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      iVar9 = pAVar15->datatype_;
      pAVar15 = Specification::FeatureType::multiarraytype(pFVar30);
      pFVar30 = local_278->type_;
      if (pFVar30 == (FeatureType *)0x0) {
        pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      iVar8 = pAVar15->datatype_;
      pAVar15 = Specification::FeatureType::multiarraytype(pFVar30);
      if (((iVar31 != iVar9) || (iVar31 != iVar8)) || (iVar31 != pAVar15->datatype_)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::operator<<(local_1e8,
                        "\'confidence\' and \'coordinates\' must use a same element type, but ");
        poVar16 = std::operator<<(local_1e8,"\'input confidence\' is ");
        pFVar30 = pTVar12->type_;
        if (pFVar30 == (FeatureType *)0x0) {
          pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar30);
        FeatureType::toString_abi_cxx11_(&local_2c0,(FeatureType *)&local_298);
        poVar16 = std::operator<<(poVar16,(string *)&local_2c0);
        std::operator<<(poVar16,", ");
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_298._M_string_length);
        poVar16 = std::operator<<(local_1e8,"\'output confidence\' is ");
        pFVar30 = pTVar14->type_;
        if (pFVar30 == (FeatureType *)0x0) {
          pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar30);
        FeatureType::toString_abi_cxx11_(&local_2c0,(FeatureType *)&local_298);
        poVar16 = std::operator<<(poVar16,(string *)&local_2c0);
        std::operator<<(poVar16,", ");
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_298._M_string_length);
        poVar16 = std::operator<<(local_1e8,"\'input coordinates\' are ");
        pFVar30 = pTVar13->type_;
        if (pFVar30 == (FeatureType *)0x0) {
          pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar30);
        FeatureType::toString_abi_cxx11_(&local_2c0,(FeatureType *)&local_298);
        poVar16 = std::operator<<(poVar16,(string *)&local_2c0);
        std::operator<<(poVar16,", ");
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_298._M_string_length);
        poVar16 = std::operator<<(local_1e8,"and \'output coordinates\' are ");
        pFVar30 = local_278->type_;
        if (pFVar30 == (FeatureType *)0x0) {
          pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar30);
        FeatureType::toString_abi_cxx11_(&local_2c0,(FeatureType *)&local_298);
        poVar16 = std::operator<<(poVar16,(string *)&local_2c0);
        std::operator<<(poVar16,".");
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_298._M_string_length);
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_2c0);
LAB_0056bd75:
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        goto LAB_0056c39b;
      }
      if (local_208->specificationversion_ < 5) {
        if (iVar31 == 0x10040) goto LAB_0056bd9a;
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar16 = std::operator<<(local_1e8,
                                  "The element data type of \'confidence\' and \'coordinates\' must be MultiArray<DOUBLE> for model specification version earlier than "
                                 );
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,5);
        std::operator<<(poVar16,", but ");
        poVar16 = std::operator<<(local_1e8,"\'input confidence\' is ");
        pFVar30 = pTVar12->type_;
        if (pFVar30 == (FeatureType *)0x0) {
          pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar30);
        FeatureType::toString_abi_cxx11_(&local_2c0,(FeatureType *)&local_298);
        poVar16 = std::operator<<(poVar16,(string *)&local_2c0);
        std::operator<<(poVar16,", ");
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_298._M_string_length);
        poVar16 = std::operator<<(local_1e8,"\'output confidence\' is ");
        pFVar30 = pTVar14->type_;
        if (pFVar30 == (FeatureType *)0x0) {
          pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar30);
        FeatureType::toString_abi_cxx11_(&local_2c0,(FeatureType *)&local_298);
        poVar16 = std::operator<<(poVar16,(string *)&local_2c0);
        std::operator<<(poVar16,", ");
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_298._M_string_length);
        poVar16 = std::operator<<(local_1e8,"\'input coordinates\' are ");
        pFVar30 = pTVar13->type_;
        if (pFVar30 == (FeatureType *)0x0) {
          pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar30);
        FeatureType::toString_abi_cxx11_(&local_2c0,(FeatureType *)&local_298);
        poVar16 = std::operator<<(poVar16,(string *)&local_2c0);
        std::operator<<(poVar16,", ");
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_298._M_string_length);
        poVar16 = std::operator<<(local_1e8,"and \'output coordinates\' are ");
        pFVar30 = local_278->type_;
        if (pFVar30 == (FeatureType *)0x0) {
          pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar30);
        FeatureType::toString_abi_cxx11_(&local_2c0,(FeatureType *)&local_298);
        poVar16 = std::operator<<(poVar16,(string *)&local_2c0);
        std::operator<<(poVar16,". ");
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_298._M_string_length);
        poVar16 = std::operator<<(local_1e8,
                                  "To enable MultiArray<FLOAT32>, use the model specification version "
                                 );
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,5);
        std::operator<<(poVar16," or later.");
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_2c0);
        goto LAB_0056bd75;
      }
      if ((iVar31 != 0x10020) && (iVar31 != 0x10040)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::operator<<(local_1e8,
                        "The element data type of \'confidence\' and \'coordinates\' must be either MultiArray<DOUBLE> or MultiArray<FLOAT32>, but "
                       );
        poVar16 = std::operator<<(local_1e8,"\'input confidence\' is ");
        pFVar30 = pTVar12->type_;
        if (pFVar30 == (FeatureType *)0x0) {
          pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar30);
        FeatureType::toString_abi_cxx11_(&local_2c0,(FeatureType *)&local_298);
        poVar16 = std::operator<<(poVar16,(string *)&local_2c0);
        std::operator<<(poVar16,", ");
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_298._M_string_length);
        poVar16 = std::operator<<(local_1e8,"\'output confidence\' is ");
        pFVar30 = pTVar14->type_;
        if (pFVar30 == (FeatureType *)0x0) {
          pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar30);
        FeatureType::toString_abi_cxx11_(&local_2c0,(FeatureType *)&local_298);
        poVar16 = std::operator<<(poVar16,(string *)&local_2c0);
        std::operator<<(poVar16,", ");
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_298._M_string_length);
        poVar16 = std::operator<<(local_1e8,"\'input coordinates\' are ");
        pFVar30 = pTVar13->type_;
        if (pFVar30 == (FeatureType *)0x0) {
          pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar30);
        FeatureType::toString_abi_cxx11_(&local_2c0,(FeatureType *)&local_298);
        poVar16 = std::operator<<(poVar16,(string *)&local_2c0);
        std::operator<<(poVar16,", ");
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_298._M_string_length);
        poVar16 = std::operator<<(local_1e8,"and \'output coordinates\' are ");
        pFVar30 = local_278->type_;
        if (pFVar30 == (FeatureType *)0x0) {
          pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        FeatureType::FeatureType((FeatureType *)&local_298,pFVar30);
        FeatureType::toString_abi_cxx11_(&local_2c0,(FeatureType *)&local_298);
        poVar16 = std::operator<<(poVar16,(string *)&local_2c0);
        std::operator<<(poVar16,".");
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_298._M_string_length);
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_2c0);
        goto LAB_0056bd75;
      }
LAB_0056bd9a:
      pFVar30 = pTVar14->type_;
      if (pFVar30 == (FeatureType *)0x0) {
        pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      pAVar15 = Specification::FeatureType::multiarraytype(pFVar30);
      pFVar30 = pTVar14->type_;
      if (pFVar30 == (FeatureType *)0x0) {
        pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      iVar31 = (pAVar15->shape_).current_size_;
      pAVar15 = Specification::FeatureType::multiarraytype(pFVar30);
      uVar28 = (ulong)pAVar15->_oneof_case_[0];
      if (uVar28 != 0) {
        if (pAVar15->_oneof_case_[0] == 0x1f) {
          pAVar17 = Specification::ArrayFeatureType::shaperange(pAVar15);
          uVar28 = (ulong)(pAVar17->sizeranges_).super_RepeatedPtrFieldBase.current_size_;
        }
        else {
          pAVar18 = Specification::ArrayFeatureType::enumeratedshapes(pAVar15);
          pTVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::TypeHandler>
                              (&(pAVar18->shapes_).super_RepeatedPtrFieldBase,0);
          uVar28 = (ulong)(pTVar19->shape_).current_size_;
        }
      }
      bVar7 = iVar31 == 0;
      bVar32 = uVar28 != 0;
      bVar33 = iVar31 == 2;
      bVar34 = uVar28 != 2;
      if ((!bVar7 && !bVar33 || bVar32) && (bVar34 || !bVar7)) {
        std::__cxx11::string::string
                  ((string *)&ss,
                   "If shape information is provided for confidence output, 2 dimensions must be specified using either shape (deprecated) or allowedShapes."
                   ,(allocator *)&local_2c0);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ss);
        goto LAB_0056b889;
      }
      if (bVar33 && !bVar32) {
        pFVar30 = pTVar14->type_;
        if (pFVar30 == (FeatureType *)0x0) {
          pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        pAVar15 = Specification::FeatureType::multiarraytype(pFVar30);
        iVar20 = Specification::ArrayFeatureType::shape(pAVar15,0);
        pFVar30 = local_278->type_;
        if (pFVar30 == (FeatureType *)0x0) {
          pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        pAVar15 = Specification::FeatureType::multiarraytype(pFVar30);
        iVar21 = Specification::ArrayFeatureType::shape(pAVar15,0);
        if (iVar20 != iVar21) {
          std::__cxx11::string::string
                    ((string *)&ss,
                     "Confidence and coordinates output shapes must be consistent (must have the same size along dimension 0)."
                     ,(allocator *)&local_2c0);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ss);
          goto LAB_0056b889;
        }
      }
      if (!bVar34 && bVar7) {
        pFVar30 = pTVar14->type_;
        if (pFVar30 == (FeatureType *)0x0) {
          pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        pAVar15 = Specification::FeatureType::multiarraytype(pFVar30);
        pFVar30 = local_278->type_;
        if (pFVar30 == (FeatureType *)0x0) {
          pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        uVar1 = pAVar15->_oneof_case_[0];
        pAVar15 = Specification::FeatureType::multiarraytype(pFVar30);
        if ((uVar1 == 0x1f) && (pAVar15->_oneof_case_[0] == 0x1f)) {
          pFVar30 = pTVar14->type_;
          if (pFVar30 == (FeatureType *)0x0) {
            pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          pAVar15 = Specification::FeatureType::multiarraytype(pFVar30);
          pAVar17 = Specification::ArrayFeatureType::shaperange(pAVar15);
          pFVar30 = pTVar14->type_;
          if (pFVar30 == (FeatureType *)0x0) {
            pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          pAVar15 = Specification::FeatureType::multiarraytype(pFVar30);
          pAVar22 = Specification::ArrayFeatureType::shaperange(pAVar15);
          pTVar23 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                              (&(pAVar17->sizeranges_).super_RepeatedPtrFieldBase,0);
          uVar3 = pTVar23->lowerbound_;
          pTVar23 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                              (&(pAVar22->sizeranges_).super_RepeatedPtrFieldBase,0);
          if (uVar3 == pTVar23->lowerbound_) {
            pTVar23 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                (&(pAVar17->sizeranges_).super_RepeatedPtrFieldBase,0);
            lVar4 = pTVar23->upperbound_;
            pTVar23 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                (&(pAVar22->sizeranges_).super_RepeatedPtrFieldBase,0);
            if (lVar4 == pTVar23->upperbound_) goto LAB_0056c1d7;
          }
          std::__cxx11::string::string
                    ((string *)&ss,
                     "Confidence and coordinates output shapes must be consistent (must have the same range of sizes along dimension 0)."
                     ,(allocator *)&local_2c0);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ss);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&ss,
                     "Confidence and coordinates output shapes fexibility must both be ranges",
                     (allocator *)&local_2c0);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ss);
        }
        goto LAB_0056b889;
      }
LAB_0056c1d7:
      if (local_2a0->_oneof_case_[1] == 100) {
        pSVar25 = Specification::NonMaximumSuppression::stringclasslabels(local_2a0);
        pRVar26 = (RepeatedField<long> *)
                  &(pSVar25->vector_).super_RepeatedPtrFieldBase.current_size_;
      }
      else {
        if (local_2a0->_oneof_case_[1] != 0x65) goto LAB_0056c38a;
        pIVar24 = Specification::NonMaximumSuppression::int64classlabels(local_2a0);
        pRVar26 = &pIVar24->vector_;
      }
      iVar31 = pRVar26->current_size_;
      uVar28 = (ulong)iVar31;
      if ((!bVar33 || bVar32) || (long)uVar28 < 1) {
LAB_0056c2ab:
        if ((!bVar34 && bVar7) && 0 < iVar31) {
          pFVar30 = pTVar14->type_;
          if (pFVar30 == (FeatureType *)0x0) {
            pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          pAVar15 = Specification::FeatureType::multiarraytype(pFVar30);
          pAVar17 = Specification::ArrayFeatureType::shaperange(pAVar15);
          this_01 = &pAVar17->sizeranges_;
          pTVar23 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                              (&this_01->super_RepeatedPtrFieldBase,1);
          if ((uVar28 < pTVar23->lowerbound_) ||
             ((pTVar23 = google::protobuf::internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                   (&this_01->super_RepeatedPtrFieldBase,1),
              -1 < pTVar23->upperbound_ &&
              (pTVar23 = google::protobuf::internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                   (&this_01->super_RepeatedPtrFieldBase,1),
              pTVar23->upperbound_ < (long)uVar28)))) {
            std::__cxx11::to_string(&local_298,iVar31);
            std::operator+(&local_2c0,"Number of classes is not consistent for class labels (",
                           &local_298);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                           &local_2c0,") and dimension 1 of output confidence shape range");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ss);
            std::__cxx11::string::~string((string *)&ss);
            std::__cxx11::string::~string((string *)&local_2c0);
            pbVar29 = &local_298;
            goto LAB_0056b84e;
          }
        }
        goto LAB_0056c38a;
      }
      pFVar30 = pTVar14->type_;
      if (pFVar30 == (FeatureType *)0x0) {
        pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      pAVar15 = Specification::FeatureType::multiarraytype(pFVar30);
      uVar27 = Specification::ArrayFeatureType::shape(pAVar15,1);
      if (uVar27 == uVar28) goto LAB_0056c2ab;
      std::__cxx11::to_string(&local_50,iVar31);
      std::operator+(&local_228,"Number of classes is not consistent for class labels (",&local_50);
      std::operator+(&local_298,&local_228,") and dimension 1 of output confidence shape (");
      pFVar30 = pTVar14->type_;
      if (pFVar30 == (FeatureType *)0x0) {
        pFVar30 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      pAVar15 = Specification::FeatureType::multiarraytype(pFVar30);
      iVar20 = Specification::ArrayFeatureType::shape(pAVar15,1);
      std::__cxx11::to_string(&local_70,iVar20);
      std::operator+(&local_2c0,&local_298,&local_70);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &local_2c0,")");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_228);
      pbVar29 = &local_50;
    }
  }
LAB_0056b84e:
  std::__cxx11::string::~string((string *)pbVar29);
LAB_0056c39b:
  std::__cxx11::string::~string((string *)&result.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_nonMaximumSuppression>(const Specification::Model& format) {
        const auto& description = format.description();
        const auto& nms = format.nonmaximumsuppression();
        
        //const auto& _confidenceInputFeatureName = nms.confidenceinputfeaturename();
        const auto& inputs = description.input();
        const auto& outputs = description.output();
        
        // Convenience typedefs
        typedef Specification::FeatureType FT;
        typedef Specification::Imputer::ReplaceValueCase RVC;
        
        Result result;
        
        // Validate it's an MLModel type
        result = validateModelDescription(description, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
        int confidenceInputIndex = -1;
        int coordinatesInputIndex = -1;
        int iouThresholdInputIndex = -1;
        int confidenceThresholdInputIndex = -1;
        
        // Make sure each input corresponds a feature name
        for (int i = 0; i < inputs.size(); ++i) {
            const std::string& name = inputs[i].name();
            bool used = false;
            
            if (nms.confidenceinputfeaturename().compare(name) == 0) {
                confidenceInputIndex = i;
                used = true;
            }
            
            if (nms.coordinatesinputfeaturename().compare(name) == 0) {
                coordinatesInputIndex = i;
                used = true;
            }
            
            if (nms.iouthresholdinputfeaturename().compare(name) == 0) {
                iouThresholdInputIndex = i;
                used = true;
            }
            
            if (nms.confidencethresholdinputfeaturename().compare(name) == 0) {
                confidenceThresholdInputIndex = i;
                used = true;
            }
            
            // The input was never used
            if (!used) {
                return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                              "Input feature '" + name + "' was not requested by any of the input feature names (e.g. confidenceInputFeatureName).");
            }
        }
        
        if (confidenceInputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + nms.confidenceinputfeaturename() + "' (as defined by confidenceInputFeatureName) to the model is not present in the model description.");
        }
        
        if (coordinatesInputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + nms.coordinatesinputfeaturename() + "' (as defined by coordinatesInputFeatureName) to the model is not present in the model description.");
        }
        
        int confidenceOutputIndex = -1;
        int coordinatesOutputIndex = -1;
        
        for (int i = 0; i < outputs.size(); ++i) {
            const std::string& name = outputs[i].name();
            bool used = false;
            
            if (nms.confidenceoutputfeaturename().compare(name) == 0) {
                confidenceOutputIndex = i;
                used = true;
            }
            
            if (nms.coordinatesoutputfeaturename().compare(name) == 0) {
                coordinatesOutputIndex = i;
                used = true;
            }
            
            // The output was never used
            if (!used) {
                return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                              "Output feature '" + name + "' was not requested by any of the output feature names (e.g. confidenceOutputFeatureName).");
            }
        }
        
        if (confidenceOutputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + nms.confidenceoutputfeaturename() + "' (as defined by confidenceOutputFeatureName) from the model is not present in the model description.");
        }
        
        if (coordinatesOutputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + nms.coordinatesoutputfeaturename() + "' (as defined by coordinatesOutputFeatureName) from the model is not present in the model description.");
        }
        
        // Validate the inputs
        result = validateDescriptionsContainFeatureWithNameAndType(description.input(),
                                                                   nms.confidenceinputfeaturename(),
                                                                   {FT::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        result = validateDescriptionsContainFeatureWithNameAndType(description.input(),
                                                                   nms.coordinatesinputfeaturename(),
                                                                   {FT::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the optional inputs
        if (iouThresholdInputIndex >= 0) {
            result = validateDescriptionsContainFeatureWithNameAndType(description.input(),
                                                                       nms.iouthresholdinputfeaturename(),
                                                                       {FT::kDoubleType});
            if (!result.good()) {
                return result;
            }
        }
        
        
        if (confidenceThresholdInputIndex >= 0) {
            result = validateDescriptionsContainFeatureWithNameAndType(description.input(),
                                                                       nms.confidencethresholdinputfeaturename(),
                                                                       {FT::kDoubleType});
            if (!result.good()) {
                return result;
            }
        }
        
        // Validate the outputs
        result = validateDescriptionsContainFeatureWithNameAndType(description.output(),
                                                                   nms.confidenceoutputfeaturename(),
                                                                   {FT::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        result = validateDescriptionsContainFeatureWithNameAndType(description.output(),
                                                                   nms.coordinatesoutputfeaturename(),
                                                                   {FT::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        if (!(nms.iouthreshold() >= 0.0 && nms.iouthreshold() <= 1.0)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "iouThreshold must be a value between 0.0 and 1.0.");
            
        }
        
        // Confidence can be greater than 1.0 if the user chooses to have non-probabilistic confidences.
        // However, since 0.0 is considered no confidence and used as a filler value when output shape
        // is larger than number of suppressed predictions, non-negative values are not allowed.
        if (!(nms.confidencethreshold() >= 0.0)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "confidenceThreshold must be a non-negative value. If you do not want to eliminate any predictions based on confidence, set it to 0.0.");
            
        }
        
        // Make sure the input and output type match.
        // From the above, we know that we have exactly one input and one output type.
        const auto& confidence_in = description.input()[confidenceInputIndex];
        const auto& coordinates_in = description.input()[coordinatesInputIndex];
        const auto& confidence_out = description.output()[confidenceOutputIndex];
        const auto& coordinates_out = description.output()[coordinatesOutputIndex];

        const auto confidence_in_type = confidence_in.type().multiarraytype().datatype();
        const auto confidence_out_type = confidence_out.type().multiarraytype().datatype();
        const auto coordinates_in_type = coordinates_in.type().multiarraytype().datatype();
        const auto coordinates_out_type = coordinates_out.type().multiarraytype().datatype();

        if (confidence_in_type != confidence_out_type ||
            confidence_in_type != coordinates_in_type ||
            confidence_in_type != coordinates_out_type) {
            std::stringstream ss;
            ss << "'confidence' and 'coordinates' must use a same element type, but ";
            ss << "'input confidence' is " <<  FeatureType(confidence_in.type()).toString() << ", ";
            ss << "'output confidence' is " <<  FeatureType(confidence_out.type()).toString() << ", ";
            ss << "'input coordinates' are " <<  FeatureType(coordinates_in.type()).toString() << ", ";
            ss << "and 'output coordinates' are " <<  FeatureType(coordinates_out.type()).toString() << ".";

            return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
        }

        if (format.specificationversion() >= MLMODEL_SPECIFICATION_VERSION_IOS14) {
            if (confidence_in_type != Specification::ArrayFeatureType_ArrayDataType_DOUBLE &&
                confidence_in_type != Specification::ArrayFeatureType_ArrayDataType_FLOAT32) {
                std::stringstream ss;
                ss << "The element data type of 'confidence' and 'coordinates' must be either MultiArray<DOUBLE> or MultiArray<FLOAT32>, but ";
                ss << "'input confidence' is " <<  FeatureType(confidence_in.type()).toString() << ", ";
                ss << "'output confidence' is " <<  FeatureType(confidence_out.type()).toString() << ", ";
                ss << "'input coordinates' are " <<  FeatureType(coordinates_in.type()).toString() << ", ";
                ss << "and 'output coordinates' are " <<  FeatureType(coordinates_out.type()).toString() << ".";

                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
        } else {
            if (confidence_in_type != Specification::ArrayFeatureType_ArrayDataType_DOUBLE) {
                std::stringstream ss;
                ss << "The element data type of 'confidence' and 'coordinates' must be MultiArray<DOUBLE> for model specification version earlier than " << MLMODEL_SPECIFICATION_VERSION_IOS14 << ", but ";
                ss << "'input confidence' is " <<  FeatureType(confidence_in.type()).toString() << ", ";
                ss << "'output confidence' is " <<  FeatureType(confidence_out.type()).toString() << ", ";
                ss << "'input coordinates' are " <<  FeatureType(coordinates_in.type()).toString() << ", ";
                ss << "and 'output coordinates' are " <<  FeatureType(coordinates_out.type()).toString() << ". ";
                ss << "To enable MultiArray<FLOAT32>, use the model specification version " << MLMODEL_SPECIFICATION_VERSION_IOS14 << " or later.";

                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
        }

        auto rankOfFlexibleShape = [] (const CoreML::Specification::ArrayFeatureType &marray) -> size_t {
            switch (marray.ShapeFlexibility_case()) {
                case CoreML::Specification::ArrayFeatureType::kEnumeratedShapes:
                    return marray.enumeratedshapes().shapes(0).shape_size();
                case CoreML::Specification::ArrayFeatureType::kShapeRange:
                    return marray.shaperange().sizeranges_size();
                case CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                    return 0;
            }
        };

        auto hasFlexibleShape  = [] (const CoreML::Specification::ArrayFeatureType &marray) -> size_t {
            return marray.ShapeFlexibility_case() !=  CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET;
        };

        auto hasEnumeratedShapes = [] (const CoreML::Specification::ArrayFeatureType &marray) -> size_t {
            return marray.ShapeFlexibility_case() ==  CoreML::Specification::ArrayFeatureType::kEnumeratedShapes;
        };

        auto hasShapeRange = [] (const CoreML::Specification::ArrayFeatureType &marray) -> size_t {
            return marray.ShapeFlexibility_case() ==  CoreML::Specification::ArrayFeatureType::kShapeRange;
        };

        
        size_t confOldShapeDim = confidence_out.type().multiarraytype().shape_size();
        size_t confNewShapeDim = rankOfFlexibleShape(confidence_out.type().multiarraytype());

        // These three options are all allowed, anything else will fail
        bool confUnspecified = (confOldShapeDim == 0 && confNewShapeDim == 0);
        bool confUseOld = (confOldShapeDim == 2 && confNewShapeDim == 0);
        bool confUseNew = (confOldShapeDim == 0 && confNewShapeDim == 2);

        if (!(confUnspecified || confUseOld || confUseNew)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "If shape information is provided for confidence output, 2 dimensions must be specified using either shape (deprecated) or allowedShapes.");
        }

        bool coordsUnspecified = (confOldShapeDim == 0 && confNewShapeDim == 0);
        bool coordsUseOld = (confOldShapeDim == 2 && confNewShapeDim == 0);
        bool coordsUseNew = (confOldShapeDim == 0 && confNewShapeDim == 2);
        
        if (!(coordsUnspecified || coordsUseOld || coordsUseNew)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "If shape information is provided for coordinates output, 2 dimensions must be specified using either shape (deprecated) or allowedShapes.");
        }
        
        // For now, require consistent usage of new/old
        if ((confUseOld && !coordsUseOld) || (confUseNew && !coordsUseNew)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Confidence and coordinates cannot use a mix of shape (deprecated) and allowedShapes.");
        }
        
        // If both use old shape, make sure shapes are consistent
        if (confUseOld && coordsUseOld &&
            confidence_out.type().multiarraytype().shape(0) != coordinates_out.type().multiarraytype().shape(0)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Confidence and coordinates output shapes must be consistent (must have the same size along dimension 0).");
        }
        
        // If both use new shape, make sure shapes are consistent
        if (confUseNew && coordsUseNew) {
            bool confIsRange = hasShapeRange(confidence_out.type().multiarraytype());
            bool coordsIsRange = hasShapeRange(coordinates_out.type().multiarraytype());

            // Only allow range flexibility
            if (!confIsRange || !coordsIsRange) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Confidence and coordinates output shapes fexibility must both be ranges");
            }

            // Check they have the same range across dimension 0
            const auto &confRange = confidence_out.type().multiarraytype().shaperange().sizeranges();
            const auto &coordRange = confidence_out.type().multiarraytype().shaperange().sizeranges();

            if (confRange[0].lowerbound() != coordRange[0].lowerbound() ||
                confRange[0].upperbound() != coordRange[0].upperbound()) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Confidence and coordinates output shapes must be consistent (must have the same range of sizes along dimension 0).");
            }
            
        }
        
        // If shape constraints on number of classes are defined, it must be consistent with
        // the number of labels.
        int numLabelNames;
        switch (nms.ClassLabels_case()) {
            case Specification::NonMaximumSuppression::kInt64ClassLabels:
                numLabelNames = nms.int64classlabels().vector_size();
                break;
            case Specification::NonMaximumSuppression::kStringClassLabels:
                numLabelNames = nms.stringclasslabels().vector_size();
                break;
            case Specification::NonMaximumSuppression::CLASSLABELS_NOT_SET:
                numLabelNames = 0;
                break;
        }
        
        if (confUseOld && numLabelNames > 0 &&
            confidence_out.type().multiarraytype().shape(1) != numLabelNames) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Number of classes is not consistent for class labels (" + std::to_string(numLabelNames) + ") and dimension 1 of output confidence shape (" + std::to_string(confidence_out.type().multiarraytype().shape(1)) + ")");
        }
        
        if (confUseNew && numLabelNames > 0) {
            // Already checked confUseNew is a range above
            // Just check the range is correct

            const auto &confRange = confidence_out.type().multiarraytype().shaperange().sizeranges();

            if ((numLabelNames < confRange[1].lowerbound() ||
                  (confRange[1].upperbound() >= 0  && numLabelNames > confRange[1].upperbound()))) {
                      return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                    "Number of classes is not consistent for class labels (" + std::to_string(numLabelNames) + ") and dimension 1 of output confidence shape range");
            }
        }

        return result;
    }